

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDEdgePtr> *unsorted_edges,uint minimum_chain_length,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges,bool bIgnoreCorners)

{
  ON__UINT_PTR OVar1;
  ON__UINT_PTR OVar2;
  ON__UINT_PTR OVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ON_SubDEdgePtr *pOVar10;
  ON_SubDEdge *pOVar11;
  ON_SubDEdgePtrLink *pOVar12;
  ON_SubDVertex *pOVar13;
  ON_SubDEdgePtrLink *pOVar14;
  ON_SubDEdge *this;
  ON_SubDEdgePtr *pOVar15;
  ON_SubDVertex *pOVar16;
  ON_SubDVertex *local_2e0;
  ON_SubDVertex *local_2c0;
  uint local_220;
  bool local_21a;
  bool local_219;
  uint local_214;
  ON_SubDVertex *s0;
  ON_SubDVertex *c1_1;
  ON_SubDVertex *s1;
  ON_SubDVertex *c0_1;
  undefined1 local_180 [4];
  uint n;
  ON_SimpleArray<ON_SubDEdgePtr> tail;
  ON_SubDEdge *e_1;
  ON_SubDVertex *v_1;
  uint k;
  bool bSmooth;
  ON_SubDEdge *e1;
  ON_SubDEdge *e0;
  ON_SubDVertex *c1;
  ON_SubDVertex *c0;
  ON_SubDEdgePtr OStack_128;
  uint chain_edge_count;
  uint local_11c;
  uint local_118;
  uint j1_1;
  uint j_1;
  bool bLastEdgeIsReversed;
  bool bFirstEdgeIsReversed;
  uint uStack_10c;
  bool bClosedChain;
  uint j1;
  uint j;
  ON_SubDEdgePtrLink epl1_1;
  ON_SubDEdgePtrLink epl0_1;
  undefined1 local_e0 [4];
  uint i_1;
  ON_SimpleArray<ON_SubDEdgePtr> chain;
  uint chain_count;
  ON_SubDEdgePtrLink *links_array;
  ON_SubDEdgePtrLink *epl1;
  ON_SubDVertex *v;
  ON_SubDEdgePtrLink *epl0;
  uint local_98;
  uint i0;
  uint i1;
  uint link_count;
  ON_SubDEdge *e;
  ON_SubDEdgePtr local_70;
  ON_SubDEdgePtr ep;
  undefined1 auStack_60 [4];
  uint i;
  ON_SubDEdgePtrLink epl;
  uint unset_nbrX_index;
  uint unset_nbr1_index;
  ON_SimpleArray<ON_SubDEdgePtrLink> links;
  uint unsorted_edge_count;
  bool bIgnoreCorners_local;
  ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges_local;
  uint minimum_chain_length_local;
  ON_SimpleArray<ON_SubDEdgePtr> *unsorted_edges_local;
  
  links.m_capacity._3_1_ = bIgnoreCorners;
  links.m_count = ON_SimpleArray<ON_SubDEdgePtr>::Count(unsorted_edges);
  if (links.m_count == 0) {
    ON_SimpleArray<ON_SubDEdgePtr>::SetCount(sorted_edges,0);
    unsorted_edges_local._4_4_ = 0;
  }
  else {
    ON_SimpleArray<ON_SubDEdgePtrLink>::ON_SimpleArray
              ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index,
               (ulong)(uint)(links.m_count << 1));
    epl.m_nbr_index = 0xfffffffe;
    epl.m_index = 0xffffffff;
    ON_SubDEdgePtrLink::ON_SubDEdgePtrLink((ON_SubDEdgePtrLink *)auStack_60);
    epl.m_ep.m_ptr._4_4_ = 0xffffffff;
    for (ep.m_ptr._4_4_ = 0; ep.m_ptr._4_4_ < (uint)links.m_count;
        ep.m_ptr._4_4_ = ep.m_ptr._4_4_ + 1) {
      pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[](unsorted_edges,ep.m_ptr._4_4_);
      local_70.m_ptr = pOVar10->m_ptr;
      pOVar11 = ON_SubDEdgePtr::Edge(&local_70);
      if ((((pOVar11 != (ON_SubDEdge *)0x0) && (pOVar11->m_vertex[0] != (ON_SubDVertex *)0x0)) &&
          (pOVar11->m_vertex[1] != (ON_SubDVertex *)0x0)) &&
         (pOVar11->m_vertex[0] != pOVar11->m_vertex[1])) {
        _auStack_60 = ON_SubDEdgePtr::Reversed(&local_70);
        ON_SimpleArray<ON_SubDEdgePtrLink>::Append
                  ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index,
                   (ON_SubDEdgePtrLink *)auStack_60);
        epl.m_ep.m_ptr._0_4_ = (int)epl.m_ep.m_ptr + 1;
        _auStack_60 = local_70.m_ptr;
        ON_SimpleArray<ON_SubDEdgePtrLink>::Append
                  ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index,
                   (ON_SubDEdgePtrLink *)auStack_60);
        epl.m_ep.m_ptr._0_4_ = (int)epl.m_ep.m_ptr + 1;
      }
    }
    ON_SimpleArray<ON_SubDEdgePtr>::SetCount(sorted_edges,0);
    ON_SimpleArray<ON_SubDEdgePtr>::Reserve(sorted_edges,(ulong)(uint)links.m_count);
    ON_SimpleArray<ON_SubDEdgePtrLink>::QuickSort
              ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index,
               ON_SubDEdgePtrLink::CompareVertex);
    uVar6 = ON_SimpleArray<ON_SubDEdgePtrLink>::UnsignedCount
                      ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index);
    epl0._4_4_ = 0;
    while (epl0._4_4_ < uVar6) {
      pOVar12 = ON_SimpleArray<ON_SubDEdgePtrLink>::operator[]
                          ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index,epl0._4_4_);
      pOVar13 = ON_SubDEdgePtr::RelativeVertex(&pOVar12->m_ep,0);
      local_98 = epl0._4_4_;
      do {
        local_98 = local_98 + 1;
        if (uVar6 <= local_98) break;
        pOVar14 = ON_SimpleArray<ON_SubDEdgePtrLink>::operator[]
                            ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index,local_98);
        iVar7 = ON_SubDEdgePtrLink::CompareVertex(pOVar12,pOVar14);
      } while (iVar7 == 0);
      if (pOVar13 == (ON_SubDVertex *)0x0) {
        ON_SubDIncrementErrorCount();
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                   ,0x6a48,"","Bug in code that creates the links[] array.");
      }
      else if (((links.m_capacity._3_1_ & 1) == 0) &&
              (bVar4 = ON_SubDVertex::IsCorner(pOVar13), bVar4)) {
        while (epl0._4_4_ < local_98) {
          pOVar12 = ON_SimpleArray<ON_SubDEdgePtrLink>::operator[]
                              ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index,epl0._4_4_);
          pOVar12->m_nbr_index = 0xfffffffe;
          epl0._4_4_ = epl0._4_4_ + 1;
        }
      }
      else if (epl0._4_4_ + 1 == local_98) {
        pOVar12->m_nbr_index = 0xfffffffe;
      }
      else if (epl0._4_4_ + 2 == local_98) {
        pOVar14 = ON_SimpleArray<ON_SubDEdgePtrLink>::operator[]
                            ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index,epl0._4_4_ + 1)
        ;
        pOVar12->m_nbr_index = pOVar14->m_index;
        pOVar14->m_nbr_index = pOVar12->m_index;
      }
      else {
        pOVar12 = ON_SimpleArray<ON_SubDEdgePtrLink>::Array
                            ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index);
        ON_SubDEdgePtrLink::Resolve3OrMoreEdges
                  (0xfffffffe,local_98 - epl0._4_4_,pOVar13,pOVar12 + epl0._4_4_);
      }
      epl0._4_4_ = local_98;
    }
    ON_SimpleArray<ON_SubDEdgePtrLink>::QuickSort
              ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index,
               ON_SubDEdgePtrLink::CompareIndex);
    pOVar12 = ON_SimpleArray<ON_SubDEdgePtrLink>::Array
                        ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index);
    chain.m_capacity = 0;
    ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray
              ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,(ulong)(uint)links.m_count);
    for (epl0_1.m_nbr_index = 0; epl0_1.m_nbr_index < uVar6;
        epl0_1.m_nbr_index = epl0_1.m_nbr_index + 2) {
      pOVar14 = pOVar12 + epl0_1.m_nbr_index;
      epl1_1._8_8_ = (pOVar14->m_ep).m_ptr;
      OVar1._0_4_ = pOVar14->m_index;
      OVar1._4_4_ = pOVar14->m_nbr_index;
      pOVar12[epl0_1.m_nbr_index].m_ep.m_ptr = 0;
      pOVar14 = pOVar12 + (epl0_1.m_nbr_index + 1);
      _j1 = (pOVar14->m_ep).m_ptr;
      epl1_1.m_ep.m_ptr._0_4_ = pOVar14->m_index;
      epl1_1.m_ep.m_ptr._4_4_ = pOVar14->m_nbr_index;
      pOVar12[epl0_1.m_nbr_index + 1].m_ep.m_ptr = 0;
      pOVar11 = ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)&epl1_1.m_index);
      if (pOVar11 != (ON_SubDEdge *)0x0) {
        ON_SimpleArray<ON_SubDEdgePtr>::SetCount((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,0);
        _auStack_60 = _j1;
        epl.m_ep = epl1_1.m_ep;
        while (epl.m_ep.m_ptr._4_4_ < 0xfffffffe) {
          uStack_10c = epl.m_ep.m_ptr._4_4_;
          if ((epl.m_ep.m_ptr & 0x100000000) == 0) {
            local_214 = epl.m_ep.m_ptr._4_4_ + 1;
          }
          else {
            local_214 = epl.m_ep.m_ptr._4_4_ - 1;
          }
          j_1 = local_214;
          pOVar14 = pOVar12 + local_214;
          _auStack_60 = (pOVar14->m_ep).m_ptr;
          OVar2._0_4_ = pOVar14->m_index;
          OVar2._4_4_ = pOVar14->m_nbr_index;
          pOVar12[epl.m_ep.m_ptr._4_4_].m_ep.m_ptr = 0;
          pOVar12[local_214].m_ep.m_ptr = 0;
          epl.m_ep.m_ptr = OVar2;
          pOVar11 = ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)auStack_60);
          if (pOVar11 == (ON_SubDEdge *)0x0) break;
          ON_SimpleArray<ON_SubDEdgePtr>::Append
                    ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,(ON_SubDEdgePtr *)auStack_60);
        }
        uVar8 = ON_SimpleArray<ON_SubDEdgePtr>::UnsignedCount
                          ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
        local_219 = false;
        if (uVar8 != 0) {
          local_219 = (int)epl.m_ep.m_ptr == (int)epl1_1.m_ep.m_ptr;
        }
        j1_1._3_1_ = local_219;
        local_21a = false;
        if (local_219 == false) {
          local_21a = false;
          if (0xfffffffd < epl.m_ep.m_ptr._4_4_) {
            local_21a = (epl.m_ep.m_ptr & 1) == 0;
          }
        }
        j1_1._2_1_ = local_21a;
        j1_1._1_1_ = 0;
        if (local_219 == false) {
          ON_SimpleArray<ON_SubDEdgePtr>::Reverse((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
        }
        ON_SimpleArray<ON_SubDEdgePtr>::Append
                  ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,(ON_SubDEdgePtr *)&j1);
        if ((j1_1._3_1_ & 1) == 0) {
          auStack_60 = (undefined1  [4])epl1_1.m_index;
          i = epl1_1.m_nbr_index;
          epl.m_ep.m_ptr = OVar1;
          while (epl.m_ep.m_ptr._4_4_ < 0xfffffffe) {
            local_118 = epl.m_ep.m_ptr._4_4_;
            if ((epl.m_ep.m_ptr & 0x100000000) == 0) {
              local_220 = epl.m_ep.m_ptr._4_4_ + 1;
            }
            else {
              local_220 = epl.m_ep.m_ptr._4_4_ - 1;
            }
            local_11c = local_220;
            pOVar14 = pOVar12 + local_220;
            _auStack_60 = (pOVar14->m_ep).m_ptr;
            OVar3._0_4_ = pOVar14->m_index;
            OVar3._4_4_ = pOVar14->m_nbr_index;
            pOVar12[epl.m_ep.m_ptr._4_4_].m_ep.m_ptr = 0;
            pOVar12[local_220].m_ep.m_ptr = 0;
            epl.m_ep.m_ptr = OVar3;
            pOVar11 = ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)auStack_60);
            if (pOVar11 == (ON_SubDEdge *)0x0) break;
            OStack_128 = ON_SubDEdgePtr::Reversed((ON_SubDEdgePtr *)auStack_60);
            ON_SimpleArray<ON_SubDEdgePtr>::Append
                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,&stack0xfffffffffffffed8);
          }
          j1_1._1_1_ = (epl.m_ep.m_ptr & 1) == 0;
          if (((j1_1._2_1_ & 1) != 0) && ((bool)j1_1._1_1_)) {
            ReverseEdgeChain((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
          }
        }
        else {
          ON_SimpleArray<ON_SubDEdgePtr>::Reverse((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
        }
        uVar8 = ON_SimpleArray<ON_SubDEdgePtr>::UnsignedCount
                          ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
        if (uVar8 != 0) {
          if (2 < uVar8) {
            pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,0);
            pOVar13 = ON_SubDEdgePtr::RelativeVertex(pOVar10,0);
            if ((pOVar13 != (ON_SubDVertex *)0x0) &&
               (bVar4 = ON_SubDVertex::IsCorner(pOVar13), !bVar4)) {
              pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                  ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,uVar8 - 1);
              pOVar16 = ON_SubDEdgePtr::RelativeVertex(pOVar10,1);
              if (pOVar13 == pOVar16) {
                pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                    ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,0);
                pOVar11 = ON_SubDEdgePtr::Edge(pOVar10);
                if (pOVar11 != (ON_SubDEdge *)0x0) {
                  pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,uVar8 - 1);
                  this = ON_SubDEdgePtr::Edge(pOVar10);
                  if (this != (ON_SubDEdge *)0x0) {
                    bVar4 = ON_SubDEdge::IsSmooth(pOVar11);
                    bVar5 = ON_SubDEdge::IsSmooth(this);
                    if ((bVar4 == bVar5) &&
                       ((!bVar4 || (bVar5 = ON_SubDVertex::IsCrease(pOVar13), !bVar5)))) {
                      v_1._0_4_ = 1;
LAB_008afc01:
                      if ((uint)v_1 < uVar8) {
                        pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                            ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,(uint)v_1);
                        pOVar13 = ON_SubDEdgePtr::RelativeVertex(pOVar10,0);
                        if (pOVar13 != (ON_SubDVertex *)0x0) {
                          pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                              ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,(uint)v_1)
                          ;
                          tail._16_8_ = ON_SubDEdgePtr::Edge(pOVar10);
                          if ((ON_SubDEdge *)tail._16_8_ != (ON_SubDEdge *)0x0) {
                            bVar5 = ON_SubDEdge::IsSmooth((ON_SubDEdge *)tail._16_8_);
                            if ((bVar4 == bVar5) &&
                               ((!bVar4 ||
                                (bVar5 = ON_SubDVertex::IsCreaseOrCorner(pOVar13), !bVar5))))
                            goto LAB_008afe36;
                            ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray
                                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_180);
                            pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                                ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                            ON_SimpleArray<ON_SubDEdgePtr>::Append
                                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_180,(uint)v_1,pOVar10
                                      );
                            for (c0_1._4_4_ = (uint)v_1; c0_1._4_4_ < uVar8;
                                c0_1._4_4_ = c0_1._4_4_ + 1) {
                              pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                                  ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,
                                                   c0_1._4_4_);
                              pOVar15 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                                  ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,
                                                   c0_1._4_4_ - (uint)v_1);
                              pOVar15->m_ptr = pOVar10->m_ptr;
                            }
                            ON_SimpleArray<ON_SubDEdgePtr>::SetCount
                                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,uVar8 - (uint)v_1)
                            ;
                            iVar7 = ON_SimpleArray<ON_SubDEdgePtr>::Count
                                              ((ON_SimpleArray<ON_SubDEdgePtr> *)local_180);
                            pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                                ((ON_SimpleArray<ON_SubDEdgePtr> *)local_180);
                            ON_SimpleArray<ON_SubDEdgePtr>::Append
                                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,iVar7,pOVar10);
                            ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray
                                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_180);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uVar9 = ON_SimpleArray<ON_SubDEdgePtr>::UnsignedCount
                            ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
          if (minimum_chain_length <= uVar9) {
            pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,0);
            pOVar13 = ON_SubDEdgePtr::RelativeVertex(pOVar10,0);
            pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Last(sorted_edges);
            if (pOVar10 == (ON_SubDEdgePtr *)0x0) {
              local_2c0 = (ON_SubDVertex *)0x0;
            }
            else {
              pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Last(sorted_edges);
              local_2c0 = ON_SubDEdgePtr::RelativeVertex(pOVar10,1);
            }
            if ((pOVar13 == (ON_SubDVertex *)0x0) || (pOVar13 != local_2c0)) {
              chain.m_capacity = chain.m_capacity + 1;
              iVar7 = ON_SimpleArray<ON_SubDEdgePtr>::Count
                                ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
              pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                  ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
              ON_SimpleArray<ON_SubDEdgePtr>::Append(sorted_edges,iVar7,pOVar10);
            }
            else {
              pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::operator[]
                                  ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0,uVar8 - 1);
              pOVar16 = ON_SubDEdgePtr::RelativeVertex(pOVar10,1);
              pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::First(sorted_edges);
              if (pOVar10 == (ON_SubDEdgePtr *)0x0) {
                local_2e0 = (ON_SubDVertex *)0x0;
              }
              else {
                pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::First(sorted_edges);
                local_2e0 = ON_SubDEdgePtr::RelativeVertex(pOVar10,0);
              }
              if (pOVar16 == local_2e0) {
                if (((pOVar16 == local_2c0) || ((j1_1._3_1_ & 1) != 0)) ||
                   ((((j1_1._2_1_ & 1) == 0 || ((j1_1._1_1_ & 1) != 0)) &&
                    (((j1_1._2_1_ & 1) != 0 || ((j1_1._1_1_ & 1) == 0)))))) {
                  if (((pOVar13 == local_2e0) || ((j1_1._3_1_ & 1) != 0)) ||
                     ((((j1_1._2_1_ & 1) == 0 || ((j1_1._1_1_ & 1) != 0)) &&
                      (((j1_1._2_1_ & 1) != 0 || ((j1_1._1_1_ & 1) == 0)))))) {
                    if ((pOVar16 == local_2c0) || ((j1_1._3_1_ & 1) != 0)) {
                      if ((pOVar13 == local_2e0) || ((j1_1._3_1_ & 1) != 0)) {
                        iVar7 = ON_SimpleArray<ON_SubDEdgePtr>::Count
                                          ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                        pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                            ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                        ON_SimpleArray<ON_SubDEdgePtr>::Append(sorted_edges,iVar7,pOVar10);
                      }
                      else {
                        ReverseEdgeChain((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                        chain.m_capacity = chain.m_capacity + 1;
                        iVar7 = ON_SimpleArray<ON_SubDEdgePtr>::Count
                                          ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                        pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                            ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                        ON_SimpleArray<ON_SubDEdgePtr>::Prepend(sorted_edges,iVar7,pOVar10);
                      }
                    }
                    else {
                      ReverseEdgeChain((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                      chain.m_capacity = chain.m_capacity + 1;
                      iVar7 = ON_SimpleArray<ON_SubDEdgePtr>::Count
                                        ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                      pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                          ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                      ON_SimpleArray<ON_SubDEdgePtr>::Append(sorted_edges,iVar7,pOVar10);
                    }
                  }
                  else {
                    ReverseEdgeChain((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                    chain.m_capacity = chain.m_capacity + 1;
                    iVar7 = ON_SimpleArray<ON_SubDEdgePtr>::Count
                                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                    pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                        ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                    ON_SimpleArray<ON_SubDEdgePtr>::Prepend(sorted_edges,iVar7,pOVar10);
                  }
                }
                else {
                  ReverseEdgeChain((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                  chain.m_capacity = chain.m_capacity + 1;
                  iVar7 = ON_SimpleArray<ON_SubDEdgePtr>::Count
                                    ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                  pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                  ON_SimpleArray<ON_SubDEdgePtr>::Append(sorted_edges,iVar7,pOVar10);
                }
              }
              else {
                chain.m_capacity = chain.m_capacity + 1;
                iVar7 = ON_SimpleArray<ON_SubDEdgePtr>::Count
                                  ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                pOVar10 = ON_SimpleArray<ON_SubDEdgePtr>::Array
                                    ((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
                ON_SimpleArray<ON_SubDEdgePtr>::Prepend(sorted_edges,iVar7,pOVar10);
              }
            }
          }
        }
        uVar8 = ON_SimpleArray<ON_SubDEdgePtr>::UnsignedCount(sorted_edges);
        if (uVar6 == uVar8 * 2) break;
      }
    }
    unsorted_edges_local._4_4_ = chain.m_capacity;
    ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray((ON_SimpleArray<ON_SubDEdgePtr> *)local_e0);
    ON_SimpleArray<ON_SubDEdgePtrLink>::~ON_SimpleArray
              ((ON_SimpleArray<ON_SubDEdgePtrLink> *)&unset_nbrX_index);
  }
  return unsorted_edges_local._4_4_;
LAB_008afe36:
  v_1._0_4_ = (uint)v_1 + 1;
  goto LAB_008afc01;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDEdgePtr >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges,
  const bool bIgnoreCorners
)
{
  // NOTE:
  //  unsorted_edges[] and sorted_edges[] may reference the same array.
  ////const ON_SubDEdge* ee[2] = {};
  ////const ON_SubDVertex* vv[2] = {};

  const unsigned int unsorted_edge_count = unsorted_edges.Count();
  if (unsorted_edge_count <= 0)
  {
    sorted_edges.SetCount(0);
    return 0;
  }

  ON_SimpleArray< ON_SubDEdgePtrLink > links(2*unsorted_edge_count);
  const unsigned int unset_nbr1_index = 0xFFFFFFFEU;
  const unsigned int unset_nbrX_index = unset_nbr1_index+1;
  ON_SubDEdgePtrLink epl;
  epl.m_nbr_index = unset_nbrX_index;
  for (unsigned int i = 0; i < unsorted_edge_count; i++)
  {
    ON_SubDEdgePtr ep = unsorted_edges[i];
    const ON_SubDEdge* e = ep.Edge();
    if (nullptr == e || nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0] == e->m_vertex[1])
      continue;

    // unsorted_edges[i] has 2 links with m_index = 2*i and m_index = 2*+1.

    // links with even m_index have opposite orientation as unsorted_edges[].
    // links[2*i].m_ep.RelativeVertex(0) = unsorted_edges[i].RelativeVertex(1)
    epl.m_ep = ep.Reversed();
    links.Append(epl);
    ++epl.m_index;
    ////ee[0] = epl.m_ep.Edge();
    ////vv[1] = epl.m_ep.RelativeVertex(0);

    // links with odd m_index have same orientation as unsorted_edges[].
    // links[2*i+1].m_ep.RelativeVertex(0) = unsorted_edges[i].RelativeVertex(0)
    epl.m_ep = ep;
    links.Append(epl);
    ++epl.m_index;
    ////ee[1] = epl.m_ep.Edge();
    ////vv[0] = epl.m_ep.RelativeVertex(0);
    ////if (e != ee[0] || e != ee[1] || vv[0] == vv[1])
    ////  return false;
  }

  // NOTE:
  // unsorted_edges[] and sorted_edges[] may reference the same array.
  // At this point, I'm finished with unsorted_edges[] so it's ok to 
  // modify sorted_edges[] here.
  sorted_edges.SetCount(0);
  sorted_edges.Reserve(unsorted_edge_count);

  // sort links by ON_SubDEdgePtr.RelativeVertex(0) and set m_nbr_index
  links.QuickSort(ON_SubDEdgePtrLink::CompareVertex);
  // link_count = even number
  const unsigned int link_count = links.UnsignedCount();
  unsigned int i1 = link_count;
  for (unsigned int i0 = 0; i0 < link_count; i0 = i1)
  {
    ON_SubDEdgePtrLink& epl0 = links[i0];
    const ON_SubDVertex* v = epl0.m_ep.RelativeVertex(0);
    for (i1 = i0 + 1; i1 < link_count; ++i1)
    {
      if (0 != ON_SubDEdgePtrLink::CompareVertex(&epl0, &links[i1]))
        break;
    }
    if (nullptr == v)
    {
      ON_SUBD_ERROR("Bug in code that creates the links[] array.");
      continue;
    }
    if (!bIgnoreCorners)
    {
      if (v->IsCorner())
      {
        // These edges will be at the ends of chains.
        while (i0 < i1)
          links[i0++].m_nbr_index = unset_nbr1_index;
        continue;
      }
    }

    if (i0 + 1 == i1)
    {
      // The vertex is referenced by exactly 1 edge in unsorted_edges[]
      // This edge will appear in sorted_edges[] at the start or end of a chain.
      epl0.m_nbr_index = unset_nbr1_index;
      continue; 
    }
    if (i0 + 2 == i1)
    {
      // This vertex is referenced by exactly 2 edges in  unsorted_edges[].
      // The vertex will be in the interior of a chain and the edges will 
      // appear in sorted_edges[] next to each other in the same chain.
      ON_SubDEdgePtrLink& epl1 = links[i0 + 1];
      epl0.m_nbr_index = epl1.m_index;
      epl1.m_nbr_index = epl0.m_index;
      continue;
    }

    // The vertex referenced by 3 or more edges in unsorted_edges[].
    // If the case cannot be resolved by Resolve3OrMoreEdges(), 
    // then this vertex will not be in the interior of a chain.
    ON_SubDEdgePtrLink::Resolve3OrMoreEdges(
      unset_nbr1_index,
      i1 - i0,
      v,
      links.Array() + i0
    );
  }

  // Sort links[] by m_index value to restore links[] to its original order.
  links.QuickSort(ON_SubDEdgePtrLink::CompareIndex);
  ON_SubDEdgePtrLink* links_array = links.Array();

  unsigned chain_count = 0;
  ON_SimpleArray<ON_SubDEdgePtr> chain(unsorted_edge_count);

  for (unsigned int i = 0; i < link_count; ++i)
  {
    // epl0 and epl1 are the links for edges[i/2]
    const ON_SubDEdgePtrLink epl0 = links_array[i];
    links_array[i].m_ep = ON_SubDEdgePtr::Null;
    const ON_SubDEdgePtrLink epl1 = links_array[++i];
    links_array[i].m_ep = ON_SubDEdgePtr::Null;

    if (nullptr == epl0.m_ep.Edge())
      continue; // this edge has already been inserted in sorted_edges[].

    chain.SetCount(0);

    // Add edges that come "before" edges[i/2] to chain[]
    epl = epl1;
    for (;;)
    {
      if (epl.m_nbr_index >= unset_nbr1_index)
        break;
      unsigned int j = epl.m_nbr_index;
      unsigned int j1 = (0 == (j % 2)) ? (j + 1) : (j - 1);
      // epl = "previous" link
      epl = links_array[j1];
      links_array[j].m_ep = ON_SubDEdgePtr::Null;
      links_array[j1].m_ep = ON_SubDEdgePtr::Null;
      if (nullptr == epl.m_ep.Edge())
        break;
      ////ee[0] = epl.m_ep.Edge();
      ////vv[0] = epl.m_ep.RelativeVertex(0);
      ////vv[1] = epl.m_ep.RelativeVertex(1);
      ////if (vv[0] == vv[1] || nullptr == ee[0])
      ////  return false;
      chain.Append(epl.m_ep);
    }

    const bool bClosedChain =
        chain.UnsignedCount() > 0 && (epl.m_index == epl1.m_index);
    const bool bFirstEdgeIsReversed = !bClosedChain &&
                                      unset_nbr1_index <= epl.m_nbr_index &&
                                      (0 == (epl.m_index % 2));
    bool bLastEdgeIsReversed{false};
    if (false == bClosedChain)
    {
      chain.Reverse();
    }

    ////ee[0] = epl1.m_ep.Edge();
    ////vv[0] = epl1.m_ep.RelativeVertex(0);
    ////vv[1] = epl1.m_ep.RelativeVertex(1);
    ////if (vv[0] == vv[1] || nullptr == ee[0])
    ////  return false;
    chain.Append(epl1.m_ep); // matches input edge orientation

    if (bClosedChain)
    {
      // put edges[i/2] at the start of the closed chain.
      chain.Reverse();
    }
    else
    {
      // Add edges that come "after" edges[i/2] to chain[]
      epl = epl0;
      for (;;)
      {
        if (epl.m_nbr_index >= unset_nbr1_index)
          break;
        unsigned int j = epl.m_nbr_index;
        unsigned int j1 = (0 == (j % 2)) ? (j + 1) : (j - 1);
        // epl = "next" link
        epl = links_array[j1];
        links_array[j].m_ep = ON_SubDEdgePtr::Null;
        links_array[j1].m_ep = ON_SubDEdgePtr::Null;
        if (nullptr == epl.m_ep.Edge())
          break;
        ////ee[0] = epl.m_ep.Edge();
        ////vv[0] = epl.m_ep.RelativeVertex(1);
        ////vv[1] = epl.m_ep.RelativeVertex(0);
        ////if (vv[0] == vv[1] || nullptr == ee[0])
        ////  return false;
        chain.Append(epl.m_ep.Reversed());
      }

      // No need to update bClosedChain here: if it was closed, then the circle
      // was found with the edges "before" edges[i/2]

      // First and last edge are reversed: reverse chain direction to keep first
      // edge direction the same as in unsorted_edges
      bLastEdgeIsReversed = epl.m_index % 2 == 0;
      if (bFirstEdgeIsReversed && bLastEdgeIsReversed) {
        ReverseEdgeChain(chain);
      }
    }

    const unsigned int chain_edge_count = chain.UnsignedCount();
    if (chain_edge_count > 0)
    {
      for (;;)
      {
        if (chain_edge_count < 3)
          break;
        const ON_SubDVertex* c0 = chain[0].RelativeVertex(0);
        if (nullptr == c0)
          break;
        if (c0->IsCorner())
          break;
        const ON_SubDVertex* c1 = chain[chain_edge_count-1].RelativeVertex(1);
        if (c0 != c1)
          break;
        const ON_SubDEdge* e0 = chain[0].Edge();
        if (nullptr == e0)
          break;
        const ON_SubDEdge* e1 = chain[chain_edge_count-1].Edge();
        if (nullptr == e1)
          break;
        const bool bSmooth = e0->IsSmooth();
        if (bSmooth != e1->IsSmooth())
          break;
        if (bSmooth && c0->IsCrease())
          break;
        // Check for an embedded crease vertex.
        for (unsigned int k = 1; k < chain_edge_count; ++k)
        {
          const ON_SubDVertex* v = chain[k].RelativeVertex(0);
          if (nullptr == v)
            break;
          const ON_SubDEdge* e = chain[k].Edge();
          if (nullptr == e)
            break;
          if (
            bSmooth != e->IsSmooth()
            || (bSmooth && v->IsCreaseOrCorner())
            )
          {
            // shift chain[] so it begins at chain[k];
            ON_SimpleArray<ON_SubDEdgePtr> tail;
            tail.Append(k, chain.Array());
            for (unsigned n = k; n < chain_edge_count; ++n)
              chain[n - k] = chain[n];
            chain.SetCount(chain_edge_count - k);
            chain.Append(tail.Count(), tail.Array());
            break;
          }
        }
        break;
      }
#ifdef ON_DEBUG
      unsigned temp_chain_edge_count{chain_edge_count};
      ON_2udex temp_udex{0U, (unsigned)(chain_edge_count - 1)};
      if (!Internal_VerifyEdgeChain(chain, temp_udex, &temp_chain_edge_count)) {
        temp_chain_edge_count = 0;
      }
      Internal_UnrollChain(chain);
#endif
      if (chain.UnsignedCount() >= minimum_chain_length) {
        const ON_SubDVertex* c0{chain[0].RelativeVertex(0)};
        const ON_SubDVertex* s1{sorted_edges.Last() == nullptr
                                    ? nullptr
                                    : sorted_edges.Last()->RelativeVertex(1)};
        if (c0 != nullptr && c0 == s1) {
          // If the first vertex of the chain is a corner, or a vertex with more
          // than 2 edges referencing it, we might have artificially split the
          // chain at that vertex and the last vertex of the previous chain is
          // the same as ours. Try a few tricks to put a gap between these two
          // vertices.
          const ON_SubDVertex* c1{
              chain[chain_edge_count - 1].RelativeVertex(1)};
          const ON_SubDVertex* s0{
              sorted_edges.First() == nullptr
                  ? nullptr
                  : sorted_edges.First()->RelativeVertex(0)};
          // By order of importance, try to:
          //   - Keep the orientation of the first edge the same as in unsorted_edges
          //   - Not use ReverseEdgeChain()
          //   - Append rather than Prepend to sorted_edges
          if (c1 != s0) {
            ++chain_count;
            sorted_edges.Prepend(chain.Count(), chain.Array());
          } else if (c1 != s1 && !bClosedChain &&
                     ((bFirstEdgeIsReversed && !bLastEdgeIsReversed) ||
                      (!bFirstEdgeIsReversed && bLastEdgeIsReversed))) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Append(chain.Count(), chain.Array());
          } else if (c0 != s0 && !bClosedChain &&
                     ((bFirstEdgeIsReversed && !bLastEdgeIsReversed) ||
                      (!bFirstEdgeIsReversed && bLastEdgeIsReversed))) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Prepend(chain.Count(), chain.Array());
          } else if (c1 != s1 && !bClosedChain) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Append(chain.Count(), chain.Array());
          } else if (c0 != s0 && !bClosedChain) {
            ReverseEdgeChain(chain);
            ++chain_count;
            sorted_edges.Prepend(chain.Count(), chain.Array());
          } else {
            // We tried, but nothing works easily enough: append the chain as
            // usual, this means the two chains are merged and chain_count does
            // not increase.
            sorted_edges.Append(chain.Count(), chain.Array());
          }
        } else {
          ++chain_count;
          sorted_edges.Append(chain.Count(), chain.Array());
        }
      }
    }

    if ( link_count == 2*sorted_edges.UnsignedCount() )
      break; // we've used all the links - no need to "skip over the rest".
  }
#ifdef ON_DEBUG
  Internal_UnrollChain(sorted_edges);
  if (!Internal_CountAndVerifyEdgeChains(sorted_edges, &chain_count)) {
    return chain_count;
  }
#endif
  return chain_count;
}